

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::bracketElse(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Cell CVar1;
  Cell CVar2;
  uint uVar3;
  uint src;
  int iVar4;
  int iVar5;
  bool bVar6;
  string currentWord;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->dStack;
  iVar5 = 1;
  do {
    while( true ) {
      CVar1 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
      CVar2 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      if (0 < (int)(CVar1 - CVar2)) break;
LAB_00111b43:
      refillNextLine(this);
    }
    requireDStackAvailable(this,1,"BL");
    ForthStack<unsigned_int>::push(this_00,0x20);
    word(this);
    count(this);
    uVar3 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    src = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    if (uVar3 == 0) goto LAB_00111b43;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    moveFromDataSpace(this,&local_50,src,(ulong)uVar3);
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_50,"[IF]");
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_50,"[ELSE]");
      if (iVar4 != 0) {
        if (iVar5 == 1) {
          iVar5 = 0;
        }
        goto LAB_00111bbb;
      }
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_50,"[THEN]");
      iVar5 = iVar5 - (uint)(iVar4 != 0);
      bVar6 = iVar5 != 0;
    }
    else {
      iVar5 = iVar5 + 1;
LAB_00111bbb:
      bVar6 = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void bracketElse(){
			int level = 1;
			while (true){
				while (getSourceBufferRemain() > 0 ) {
					bl();
					word();
					count();
					auto length = SIZE_T(dStack.getTop()); pop();
					auto caddr = CADDR(dStack.getTop()); pop();
					if (length > 0) {
						std::string currentWord{};
						moveFromDataSpace(currentWord, caddr, length);
						if (currentWord.compare("[IF]")) { level++; }
						else {
							if (currentWord.compare("[ELSE]")) { level--; if (level) level++; }
							else {
								if (currentWord.compare("[THEN]")) { level--; }
								if (level == 0) return;
							}
						}
					}
					else {
						break;
					}
				}
				refillNextLine();
			}
		}